

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

int psort_(double *a,int n,int *ind,int ni)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  double dVar21;
  int local_13c [3];
  int il [16];
  int iu [16];
  int indl [16];
  int indu [16];
  
  uVar9 = (ulong)(uint)n;
  if (((ni | n) < 0) || (ni == 0 || n < 2)) {
    return 0;
  }
  iu[0xe] = 1;
  indl[0xe] = ni;
  iVar19 = 1;
  iVar3 = 1;
LAB_00152881:
  iVar15 = 1;
  iVar20 = iVar19;
  if ((int)uVar9 < 2) goto LAB_00152a2e;
  do {
    uVar14 = uVar9 & 0xffffffff;
    iVar8 = (int)uVar9;
    lVar13 = (long)((iVar8 + iVar15) / 2);
    dVar21 = a[lVar13 + -1];
    if (dVar21 < a[(long)iVar15 + -1]) {
      a[lVar13 + -1] = a[(long)iVar15 + -1];
      a[(long)iVar15 + -1] = dVar21;
      dVar21 = a[lVar13 + -1];
    }
    uVar9 = (ulong)iVar8;
    iVar18 = iVar15;
    if (a[uVar9 - 1] < dVar21) {
      a[lVar13 + -1] = a[uVar9 - 1];
      a[uVar9 - 1] = dVar21;
      dVar21 = a[lVar13 + -1];
      if (dVar21 < a[(long)iVar15 + -1]) {
        a[lVar13 + -1] = a[(long)iVar15 + -1];
        a[(long)iVar15 + -1] = dVar21;
        dVar21 = a[lVar13 + -1];
      }
    }
    while( true ) {
      do {
        uVar10 = uVar9;
        dVar2 = a[uVar10 - 2];
        uVar9 = uVar10 - 1;
      } while (dVar21 < dVar2);
      lVar13 = ((long)iVar18 << 0x20) + -0x100000000;
      pdVar6 = a + iVar18;
      do {
        iVar17 = iVar18;
        pdVar5 = pdVar6;
        lVar13 = lVar13 + 0x100000000;
        iVar18 = iVar17 + 1;
        pdVar6 = pdVar5 + 1;
      } while (*pdVar5 < dVar21);
      if ((long)uVar9 <= lVar13 >> 0x20) break;
      a[uVar10 - 2] = *pdVar5;
      *pdVar5 = (double)(int)dVar2;
    }
    iu[(long)iVar19 + 0xd] = iVar3;
    indl[(long)iVar19 + 0xd] = ni;
    iVar20 = iVar19 + 1;
    iVar7 = (int)uVar9;
    if (iVar8 - iVar18 < iVar7 - iVar15) {
      local_13c[iVar19] = iVar15;
      il[(long)iVar19 + 0xd] = iVar7;
      if (iVar3 <= ni) {
        uVar16 = -iVar3;
        piVar11 = ind + (long)iVar3 + -1;
        do {
          if (iVar17 < *piVar11) {
            iVar3 = -uVar16;
            indl[(long)iVar19 + 0xd] = ~uVar16;
            uVar9 = uVar14;
            iVar15 = iVar18;
            iVar19 = iVar20;
            goto LAB_00152a89;
          }
          piVar11 = piVar11 + 1;
          iVar3 = ni + uVar16;
          uVar16 = uVar16 - 1;
        } while (iVar3 != 0);
      }
    }
    else {
      local_13c[iVar19] = iVar18;
      il[(long)iVar19 + 0xd] = iVar8;
      if (iVar3 <= ni) {
        lVar13 = (long)ni + 1;
        do {
          if (ind[lVar13 + -2] < iVar7 + 1) {
            iu[(long)iVar19 + 0xd] = ni + 1;
            iVar19 = iVar20;
            goto LAB_00152a89;
          }
          ni = ni + -1;
          lVar13 = lVar13 + -1;
        } while (iVar3 < lVar13);
      }
    }
LAB_00152a2e:
    while( true ) {
      lVar4 = (long)iVar20;
      lVar13 = 0;
      do {
        lVar12 = lVar13;
        if (1 - lVar4 == lVar12) {
          return 0;
        }
        iVar3 = iu[lVar4 + lVar12 + 0xc];
        ni = indl[lVar4 + lVar12 + 0xc];
        lVar13 = lVar12 + -1;
      } while (ni < iVar3);
      uVar9 = (ulong)(uint)il[lVar4 + lVar12 + 0xc];
      iVar15 = local_13c[lVar4 + lVar13];
      iVar19 = iVar20 + (int)lVar13;
LAB_00152a89:
      iVar8 = (int)uVar9;
      if (10 < iVar8 - iVar15) break;
      if (iVar15 == 1) goto LAB_00152881;
      iVar20 = iVar19;
      if (iVar8 != iVar15) {
        lVar13 = (long)iVar15;
        iVar15 = iVar15 + -1;
        pdVar6 = a + lVar13;
        do {
          dVar21 = a[(long)iVar15 + 1];
          pdVar5 = pdVar6;
          if (dVar21 < a[lVar13 + -1]) {
            do {
              *pdVar5 = pdVar5[-1];
              pdVar1 = pdVar5 + -2;
              pdVar5 = pdVar5 + -1;
            } while (dVar21 < *pdVar1);
            *pdVar5 = dVar21;
          }
          iVar15 = (int)lVar13;
          lVar13 = lVar13 + 1;
          pdVar6 = pdVar6 + 1;
        } while (iVar8 != (int)lVar13);
      }
    }
  } while( true );
}

Assistant:

int psort_(double *a, int n, int *ind, int ni)
{
    int i__, j, k, l, m, p;
    double t;
    int ij, il[16], jl, iu[16], ju;
    int tt;
    int indl[16], indu[16];


/* Partial Sorting ; used for Median (MAD) computation only */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --a;
    --ind;

    /* Function Body */
    if (n < 0 || ni < 0) {
	return 0;
    }
    if (n < 2 || ni == 0) {
	return 0;
    }
    jl = 1;
    ju = ni;
    indl[0] = 1;
    indu[0] = ni;
    i__ = 1;
    j = n;
    m = 1;
/* Outer Loop */
L161:
    if (i__ < j) {
	goto L10;
    }
/*  _Loop_ */
L166:
    --m;
    if (m == 0) {
	return 0;
    }
    i__ = il[m - 1];
    j = iu[m - 1];
    jl = indl[m - 1];
    ju = indu[m - 1];
    if (! (jl <= ju)) {
	goto L166;
    }
/*     while (j - i > 10) */
L173:
    if (! (j - i__ > 10)) {
	goto L174;
    }
L10:
    k = i__;
    ij = (i__ + j) / 2;
    t = a[ij];
    if (a[i__] > t) {
	a[ij] = a[i__];
	a[i__] = t;
	t = a[ij];
    }
    l = j;
    if (a[j] < t) {
	a[ij] = a[j];
	a[j] = t;
	t = a[ij];
	if (a[i__] > t) {
	    a[ij] = a[i__];
	    a[i__] = t;
	    t = a[ij];
	}
    }
L181:
    --l;
    if (a[l] <= t) {
	tt = a[l];
L186:
	++k;
/* L187: */
	if (! (a[k] >= t)) {
	    goto L186;
	}
	if (k > l) {
	    goto L183;
	}
	a[l] = a[k];
	a[k] = tt;
    }
/* L182: */
    goto L181;
L183:
    indl[m - 1] = jl;
    indu[m - 1] = ju;
    p = m;
    ++m;
    if (l - i__ <= j - k) {
	il[p - 1] = k;
	iu[p - 1] = j;
	j = l;
L193:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[ju] > j) {
	    --ju;
	    goto L193;
	}
	indl[p - 1] = ju + 1;
    } else {
	il[p - 1] = i__;
	iu[p - 1] = l;
	i__ = k;
L200:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[jl] < i__) {
	    ++jl;
	    goto L200;
	}
	indu[p - 1] = jl - 1;
    }
    goto L173;
/*     end while */
L174:
    if (i__ != 1) {
	--i__;
L209:
	++i__;
	if (i__ == j) {
	    goto L166;
	}
	t = a[i__ + 1];
	if (a[i__] > t) {
	    k = i__;
/*           repeat */
L216:
	    a[k + 1] = a[k];
	    --k;
	    if (! (t >= a[k])) {
		goto L216;
	    }
/*           until  t >= a(k) */
	    a[k + 1] = t;
	}
	goto L209;
    }
    goto L161;
/* End Outer Loop */
}